

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O3

ssize_t __thiscall DepthBuffer::write(DepthBuffer *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  long lVar4;
  size_t y;
  undefined4 in_register_00000034;
  size_t x;
  TGAImage image;
  TGAColor local_85;
  char *local_80;
  string local_78;
  TGAImage local_58;
  
  local_80 = (char *)CONCAT44(in_register_00000034,__fd);
  TGAImage::TGAImage(&local_58,this->width,this->height,1);
  uVar1 = this->width;
  if (uVar1 != 0) {
    uVar3 = this->height;
    lVar4 = 0;
    x = 0;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        y = 0;
        do {
          local_85.bgra[0] =
               (uint8_t)(int)*(double *)
                              ((long)(this->data).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + y * 8 + this->width * lVar4)
          ;
          local_85.bgra[1] = '\0';
          local_85.bgra[2] = '\0';
          local_85.bgra[3] = '\0';
          local_85.bytespp = '\x01';
          TGAImage::set(&local_58,x,y,&local_85);
          y = y + 1;
          uVar3 = this->height;
        } while (y < uVar3);
        uVar1 = this->width;
      }
      x = x + 1;
      lVar4 = lVar4 + 8;
    } while (x < uVar1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,local_80,(allocator<char> *)&local_85);
  TGAImage::write_tga_file(&local_58,&local_78,true,true);
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    paVar2 = extraout_RAX;
  }
  if (local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    paVar2 = extraout_RAX_00;
  }
  return (ssize_t)paVar2;
}

Assistant:

void DepthBuffer::write(const char *filename) const
{
    TGAImage image(width, height, TGAImage::GRAYSCALE);
    for (size_t i = 0; i < width; i++) {
        for (size_t j = 0; j < height; j++) {
            image.set(i, j, TGAColor(static_cast<uint8_t>(data[i * width + j])));
        }
    }
    image.write_tga_file(filename);
}